

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<float>::set_size(RepeatedField<float> *this,bool is_soo,int size)

{
  int v1;
  int iVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int size_local;
  bool is_soo_local;
  RepeatedField<float> *this_local;
  
  absl_log_internal_check_op_result._0_4_ = size;
  absl_log_internal_check_op_result._7_1_ = is_soo;
  _size_local = this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(size);
  iVar1 = Capacity(this,(bool)(absl_log_internal_check_op_result._7_1_ & 1));
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar1);
  local_20 = absl::lts_20250127::log_internal::Check_LEImpl(v1,iVar1,"size <= Capacity(is_soo)");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x1ea,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  internal::SooRep::set_size
            (&this->soo_rep_,(bool)(absl_log_internal_check_op_result._7_1_ & 1),
             (int)absl_log_internal_check_op_result);
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_LE(size, Capacity(is_soo));
    soo_rep_.set_size(is_soo, size);
  }